

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O2

void __thiscall
ft::
RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
::treeInit(RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar2;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar3;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_68;
  
  ptVar3 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->NIL = ptVar3;
  ptVar3 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->m_first = ptVar3;
  ptVar3 = (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            *)operator_new(0x48);
  this->m_last = ptVar3;
  paVar1 = &local_68.value.first.field_2;
  local_68.value.first._M_string_length = 0;
  local_68.value.first.field_2._M_local_buf[0] = '\0';
  local_68.value.second = 0;
  local_68.colour = BLACK;
  local_68.left =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.right =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.parent =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.value.first._M_dataplus._M_p = (pointer)paVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(this->NIL,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_68.value.first._M_string_length = 0;
  local_68.value.first.field_2._M_local_buf[0] = '\0';
  local_68.value.second = 0;
  local_68.colour = BLACK;
  local_68.left =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.right =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.parent =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.value.first._M_dataplus._M_p = (pointer)paVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(this->m_first,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_68.value.first._M_string_length = 0;
  local_68.value.first.field_2._M_local_buf[0] = '\0';
  local_68.value.second = 0;
  local_68.colour = BLACK;
  local_68.left =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.right =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.parent =
       (treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        *)0x0;
  local_68.value.first._M_dataplus._M_p = (pointer)paVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::treeNode(this->m_last,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  ptVar3 = this->NIL;
  ptVar3->parent = ptVar3;
  ptVar3->left = ptVar3;
  ptVar3->right = ptVar3;
  ptVar2 = this->m_first;
  ptVar2->left = ptVar3;
  ptVar2->right = ptVar3;
  ptVar2 = this->m_last;
  ptVar2->left = ptVar3;
  ptVar2->right = ptVar3;
  this->m_root = ptVar3;
  return;
}

Assistant:

void treeInit() {
		this->NIL = this->m_alloc.allocate(1);
		this->m_first = this->m_alloc.allocate(1);
		this->m_last = this->m_alloc.allocate(1);

		this->m_alloc.construct(this->NIL, BLACK);
		this->m_alloc.construct(this->m_first, BLACK);
		this->m_alloc.construct(this->m_last, BLACK);

		this->NIL->parent = this->NIL;
		this->NIL->left = this->NIL;
		this->NIL->right = this->NIL;
		this->m_first->left = this->NIL;
		this->m_first->right = this->NIL;
		this->m_last->left = this->NIL;
		this->m_last->right = this->NIL;

		this->m_root = this->NIL;
	}